

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O3

void cmSHA256_Internal_Transform(SHA_CTX *context,sha_word32 *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  cm_sha2_uint32_t cVar5;
  cm_sha2_uint32_t cVar6;
  cm_sha2_uint32_t cVar7;
  cm_sha2_uint32_t cVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  cm_sha2_uint32_t cVar20;
  uint uVar21;
  uint uVar22;
  cm_sha2_uint32_t cVar23;
  cm_sha2_uint32_t cVar24;
  cm_sha2_uint32_t cVar25;
  
  uVar1 = (context->s1).state[0];
  uVar2 = (context->s1).state[1];
  uVar3 = (context->s1).state[2];
  uVar4 = (context->s1).state[3];
  cVar5 = (context->s1).state[4];
  cVar6 = (context->s256).state[5];
  cVar7 = (context->s256).state[6];
  cVar8 = (context->s256).state[7];
  lVar18 = 0;
  uVar14 = uVar2;
  uVar15 = uVar3;
  uVar19 = uVar4;
  cVar24 = cVar5;
  cVar23 = cVar6;
  cVar20 = cVar8;
  cVar25 = cVar7;
  uVar11 = uVar1;
  do {
    uVar10 = uVar11;
    uVar21 = cVar25;
    cVar25 = cVar23;
    cVar23 = cVar24;
    uVar13 = uVar15;
    uVar15 = uVar14;
    uVar14 = *(uint *)((long)data + lVar18);
    uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
    *(uint *)((long)context + lVar18 + 0x28) = uVar14;
    iVar16 = ((cVar25 ^ uVar21) & cVar23 ^ uVar21) + cVar20 +
             ((cVar23 << 7 | cVar23 >> 0x19) ^
             (cVar23 << 0x15 | cVar23 >> 0xb) ^ (cVar23 << 0x1a | cVar23 >> 6)) + uVar14 +
             *(int *)((long)K256 + lVar18);
    cVar24 = uVar19 + iVar16;
    uVar11 = (uVar15 & uVar13 ^ (uVar15 ^ uVar13) & uVar10) +
             ((uVar10 << 10 | uVar10 >> 0x16) ^
             (uVar10 << 0x13 | uVar10 >> 0xd) ^ (uVar10 << 0x1e | uVar10 >> 2)) + iVar16;
    lVar18 = lVar18 + 4;
    uVar14 = uVar10;
    uVar19 = uVar13;
    cVar20 = uVar21;
  } while (lVar18 != 0x40);
  lVar18 = 0x1e;
  do {
    uVar9 = uVar15;
    uVar15 = uVar10;
    uVar10 = uVar11;
    uVar22 = cVar25;
    cVar25 = cVar23;
    cVar23 = cVar24;
    uVar11 = (uint)lVar18;
    uVar14 = *(uint *)((long)context + (ulong)(uVar11 - 0xd & 0xf) * 4 + 0x28);
    uVar19 = *(uint *)((long)context + (ulong)(uVar11 & 0xf) * 4 + 0x28);
    iVar16 = *(int *)("char *cmSHA384_End(SHA_CTX *, char *)" + lVar18 * 4 + 0x24);
    uVar12 = (ulong)(uVar11 - 0xe & 0xf);
    iVar17 = (uVar14 >> 3 ^ (uVar14 << 0xe | uVar14 >> 0x12) ^ (uVar14 << 0x19 | uVar14 >> 7)) +
             *(int *)((long)context + (ulong)(uVar11 - 5 & 0xf) * 4 + 0x28) +
             (uVar19 >> 10 ^ (uVar19 << 0xd | uVar19 >> 0x13) ^ (uVar19 << 0xf | uVar19 >> 0x11)) +
             *(int *)((long)context + uVar12 * 4 + 0x28);
    *(int *)((long)context + uVar12 * 4 + 0x28) = iVar17;
    iVar17 = iVar17 + ((cVar25 ^ uVar22) & cVar23 ^ uVar22) + uVar21 +
                      ((cVar23 << 7 | cVar23 >> 0x19) ^
                      (cVar23 << 0x15 | cVar23 >> 0xb) ^ (cVar23 << 0x1a | cVar23 >> 6)) + iVar16;
    cVar24 = uVar13 + iVar17;
    uVar11 = (uVar15 & uVar9 ^ (uVar15 ^ uVar9) & uVar10) +
             ((uVar10 << 10 | uVar10 >> 0x16) ^
             (uVar10 << 0x13 | uVar10 >> 0xd) ^ (uVar10 << 0x1e | uVar10 >> 2)) + iVar17;
    lVar18 = lVar18 + 1;
    uVar21 = uVar22;
    uVar13 = uVar9;
  } while (lVar18 != 0x4e);
  (context->s1).state[0] = uVar11 + uVar1;
  (context->s1).state[1] = uVar10 + uVar2;
  (context->s1).state[2] = uVar15 + uVar3;
  (context->s1).state[3] = uVar9 + uVar4;
  (context->s1).state[4] = cVar24 + cVar5;
  (context->s256).state[5] = cVar23 + cVar6;
  (context->s256).state[6] = cVar25 + cVar7;
  (context->s256).state[7] = uVar22 + cVar8;
  return;
}

Assistant:

void SHA256_Internal_Transform(SHA_CTX* context, const sha_word32* data) {
	sha_word32	a, b, c, d, e, f, g, h, s0, s1;
	sha_word32	T1, T2, *W256;
	int		j;

	W256 = (sha_word32*)context->s256.buffer;

	/* Initialize registers with the prev. intermediate value */
	a = context->s256.state[0];
	b = context->s256.state[1];
	c = context->s256.state[2];
	d = context->s256.state[3];
	e = context->s256.state[4];
	f = context->s256.state[5];
	g = context->s256.state[6];
	h = context->s256.state[7];

	j = 0;
	do {
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Copy data while converting to host byte order */
		REVERSE32(*data++,W256[j]);
		/* Apply the SHA-256 compression function to update a..h */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] + W256[j];
#else /* BYTE_ORDER == LITTLE_ENDIAN */
		/* Apply the SHA-256 compression function to update a..h with copy */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] + (W256[j] = *data++);
#endif /* BYTE_ORDER == LITTLE_ENDIAN */
		T2 = Sigma0_256(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 16);

	do {
		/* Part of the message block expansion: */
		s0 = W256[(j+1)&0x0f];
		s0 = sigma0_256(s0);
		s1 = W256[(j+14)&0x0f];
		s1 = sigma1_256(s1);

		/* Apply the SHA-256 compression function to update a..h */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] +
		     (W256[j&0x0f] += s1 + W256[(j+9)&0x0f] + s0);
		T2 = Sigma0_256(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 64);

	/* Compute the current intermediate hash value */
	context->s256.state[0] += a;
	context->s256.state[1] += b;
	context->s256.state[2] += c;
	context->s256.state[3] += d;
	context->s256.state[4] += e;
	context->s256.state[5] += f;
	context->s256.state[6] += g;
	context->s256.state[7] += h;

	/* Clean up */
	a = b = c = d = e = f = g = h = T1 = T2 = 0;
}